

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>>
::
Initialize<absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,absl::lts_20240722::str_format_internal::FormatArgImpl_const*>>
          (Storage<absl::lts_20240722::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>>
           *this,IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,_const_absl::lts_20240722::str_format_internal::FormatArgImpl_*>
                 values,
          SizeType<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>_> new_size
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  FormatArgImpl *pFVar4;
  char *pcVar5;
  long lVar6;
  SizeType<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>_> SVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  size_type __n;
  Dispatcher __n_00;
  Dispatcher p_Stack_58;
  
  if ((*(ulong *)this & 1) != 0) {
    Initialize<absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,absl::lts_20240722::str_format_internal::FormatArgImpl_const*>>
              ();
LAB_0010b295:
    Initialize<absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,absl::lts_20240722::str_format_internal::FormatArgImpl_const*>>
              ();
    if ((ulong)values.it_ >> 0x3b == 0) {
      operator_new((long)values.it_ << 4);
      return;
    }
    pFVar4 = values.it_;
    __gnu_cxx::new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>::allocate
              ((new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl> *)values.it_);
    if (extraout_RDX == 0 || values.it_ != (FormatArgImpl *)0x0) {
      __n_00 = (Dispatcher)(extraout_RDX - (long)values.it_);
      p_Stack_58 = __n_00;
      if (__n_00 < (Dispatcher)0x10) {
        pcVar5 = (char *)(pFVar4->data_).ptr;
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::_M_create((ulong *)pFVar4,(ulong)&p_Stack_58);
        (pFVar4->data_).ptr = pcVar5;
        pFVar4[1].data_.ptr = p_Stack_58;
      }
      if (__n_00 != (Dispatcher)0x0) {
        if (__n_00 == (Dispatcher)0x1) {
          *pcVar5 = ((values.it_)->data_).buf[0];
        }
        else {
          memcpy(pcVar5,values.it_,(size_t)__n_00);
        }
      }
      pFVar4->dispatcher_ = p_Stack_58;
      p_Stack_58[(long)pFVar4->data_] = (_func_bool_Data_FormatConversionSpecImpl_void_ptr)0x0;
      return;
    }
    pcVar5 = "basic_string::_M_construct null not valid";
    std::__throw_logic_error("basic_string::_M_construct null not valid");
    std::ostream::write(pcVar5,extraout_RDX_00);
    return;
  }
  if (*(ulong *)this != 0) goto LAB_0010b295;
  if (new_size < 5) {
    if (new_size == 0) {
      lVar6 = 0;
      goto LAB_0010b279;
    }
    pFVar4 = (FormatArgImpl *)(this + 8);
  }
  else {
    __n = 8;
    if (8 < new_size) {
      __n = new_size;
    }
    pFVar4 = __gnu_cxx::new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>::
             allocate((new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl> *)this,
                      __n,(void *)0x0);
    *(FormatArgImpl **)(this + 8) = pFVar4;
    *(size_type *)(this + 0x10) = __n;
    *this = (Storage<absl::lts_20240722::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>>
             )((byte)*this | 1);
  }
  lVar6 = 0;
  SVar7 = new_size;
  do {
    puVar1 = (undefined8 *)((long)&(values.it_)->data_ + lVar6);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pFVar4->data_ + lVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    lVar6 = lVar6 + 0x10;
    SVar7 = SVar7 - 1;
  } while (SVar7 != 0);
  lVar6 = *(long *)this;
LAB_0010b279:
  *(SizeType<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>_> *)this =
       lVar6 + new_size * 2;
  return;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }